

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModkSeparator.cpp
# Opt level: O0

bool separateModKCuts<5,HighsModkSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1&>
               (vector<long,_std::allocator<long>_> *intSystemValue,
               vector<int,_std::allocator<int>_> *intSystemIndex,
               vector<int,_std::allocator<int>_> *intSystemStart,HighsCutPool *cutpool,
               HighsInt numCol,anon_class_72_9_0cbbc77e *foundModKCut)

{
  HighsInt HVar1;
  HighsInt HVar2;
  HighsInt numCuts;
  HighsGFkSolve GFkSolve;
  int in_stack_fffffffffffffdb8;
  HighsInt in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdc4;
  HighsInt in_stack_fffffffffffffe44;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe58;
  HighsGFkSolve *in_stack_fffffffffffffe60;
  
  HighsGFkSolve::HighsGFkSolve(in_stack_fffffffffffffe60);
  HVar1 = HighsCutPool::getNumCuts
                    ((HighsCutPool *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  HighsGFkSolve::fromCSC<5u,1,long>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  HighsGFkSolve::setRhs<5u,1,int>
            ((HighsGFkSolve *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,0);
  HighsGFkSolve::
  solve<5u,1,HighsModkSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1&>
            ((HighsGFkSolve *)
             GFkSolve.Arow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,(anon_class_72_9_0cbbc77e *)GFkSolve._0_8_);
  HVar2 = HighsCutPool::getNumCuts
                    ((HighsCutPool *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  uVar3 = CONCAT13(HVar2 != HVar1,(int3)in_stack_fffffffffffffdc0);
  HighsGFkSolve::~HighsGFkSolve((HighsGFkSolve *)CONCAT44(HVar2,uVar3));
  return (bool)((byte)((uint)uVar3 >> 0x18) & 1);
}

Assistant:

static bool separateModKCuts(const std::vector<int64_t>& intSystemValue,
                             const std::vector<HighsInt>& intSystemIndex,
                             const std::vector<HighsInt>& intSystemStart,
                             const HighsCutPool& cutpool, HighsInt numCol,
                             FoundModKCut&& foundModKCut) {
  HighsGFkSolve GFkSolve;

  HighsInt numCuts = cutpool.getNumCuts();

  GFkSolve.fromCSC<k>(intSystemValue, intSystemIndex, intSystemStart,
                      numCol + 1);
  GFkSolve.setRhs<k>(numCol, 1);
  GFkSolve.solve<k>(foundModKCut);

  return cutpool.getNumCuts() != numCuts;
}